

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence_helpers.cpp
# Opt level: O0

vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> * __thiscall
spvtools::opt::LoopDependenceAnalysis::GetSubscripts
          (vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>
           *__return_storage_ptr__,LoopDependenceAnalysis *this,Instruction *instruction)

{
  uint uVar1;
  uint32_t uVar2;
  Instruction *local_38;
  uint local_30;
  undefined1 local_29;
  uint i;
  Instruction *access_chain;
  Instruction *instruction_local;
  LoopDependenceAnalysis *this_local;
  vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_> *subscripts;
  
  access_chain = instruction;
  instruction_local = (Instruction *)this;
  this_local = (LoopDependenceAnalysis *)__return_storage_ptr__;
  _i = GetOperandDefinition(this,instruction,0);
  local_29 = 0;
  std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::vector
            (__return_storage_ptr__);
  for (local_30 = 1; uVar1 = local_30, uVar2 = Instruction::NumInOperandWords(_i), uVar1 < uVar2;
      local_30 = local_30 + 1) {
    local_38 = GetOperandDefinition(this,_i,local_30);
    std::vector<spvtools::opt::Instruction_*,_std::allocator<spvtools::opt::Instruction_*>_>::
    push_back(__return_storage_ptr__,&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Instruction*> LoopDependenceAnalysis::GetSubscripts(
    const Instruction* instruction) {
  Instruction* access_chain = GetOperandDefinition(instruction, 0);

  std::vector<Instruction*> subscripts;

  for (auto i = 1u; i < access_chain->NumInOperandWords(); ++i) {
    subscripts.push_back(GetOperandDefinition(access_chain, i));
  }

  return subscripts;
}